

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O2

SampleCountChannel * __thiscall Imf_3_4::SampleCountChannel::slice(SampleCountChannel *this)

{
  long in_RSI;
  
  Imf_3_4::Slice::Slice
            ((Slice *)this,UINT,*(char **)(in_RSI + 0x38),4,(long)*(int *)(in_RSI + 0x1c) << 2,
             *(int *)(in_RSI + 0x10),*(int *)(in_RSI + 0x14),0.0,false,false);
  return this;
}

Assistant:

Slice
SampleCountChannel::slice () const
{
    return Slice (
        UINT,                                    // type
        (char*) _base,                           // base
        sizeof (unsigned int),                   // xStride
        pixelsPerRow () * sizeof (unsigned int), // yStride
        xSampling (),
        ySampling ());
}